

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItem.h
# Opt level: O0

void __thiscall cmLinkImplItem::cmLinkImplItem(cmLinkImplItem *this)

{
  cmLinkImplItem *this_local;
  
  cmLinkItem::cmLinkItem(&this->super_cmLinkItem);
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace);
  this->FromGenex = false;
  return;
}

Assistant:

cmLinkImplItem()
    : cmLinkItem()
    , Backtrace()
    , FromGenex(false)
  {
  }